

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cc
# Opt level: O0

void CRYPTO_pre_sandbox_init(void)

{
  OPENSSL_init_cpuid();
  CRYPTO_init_sysrand();
  CRYPTO_get_fork_generation();
  return;
}

Assistant:

void CRYPTO_pre_sandbox_init(void) {
  // Read from /proc/cpuinfo if needed.
  OPENSSL_init_cpuid();
  // Open /dev/urandom if needed.
  CRYPTO_init_sysrand();
  // Set up MADV_WIPEONFORK state if needed.
  CRYPTO_get_fork_generation();
}